

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpi.cpp
# Opt level: O3

void __thiscall pg::FPISolver::run_par(FPISolver *this,WorkerP *__lace_worker,Task *__lace_dq_head)

{
  int iVar1;
  Game *pGVar2;
  int *piVar3;
  uint64_t *puVar4;
  ostream *poVar5;
  void *pvVar6;
  void *pvVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  uint64_t uVar15;
  long lVar16;
  
  pGVar2 = (this->super_Solver).game;
  lVar16 = pGVar2->n_vertices;
  piVar3 = pGVar2->_priority;
  iVar1 = *(int *)((long)piVar3 + ((lVar16 << 0x20) + -0x100000000 >> 0x1e));
  uVar8 = 0xffffffffffffffff;
  if (-2 < iVar1) {
    uVar8 = (long)(int)(iVar1 + 1U) << 2;
  }
  pvVar6 = operator_new__(uVar8);
  pvVar7 = operator_new__(uVar8);
  if (iVar1 < 0) {
    this->iterations = 1;
  }
  else {
    uVar8 = 0;
    iVar9 = 0;
    do {
      uVar11 = (ulong)iVar9;
      if (uVar8 == (uint)piVar3[uVar11]) {
        *(int *)((long)pvVar6 + uVar8 * 4) = iVar9;
        iVar13 = iVar9;
        if (((long)uVar11 < lVar16) && (uVar8 == (uint)piVar3[uVar11])) {
          puVar4 = (this->parity)._bits;
          do {
            uVar12 = uVar11 + 1;
            uVar14 = 1L << (uVar11 & 0x3f);
            uVar11 = uVar11 >> 6;
            if ((uVar8 & 1) == 0) {
              uVar15 = ~uVar14 & puVar4[uVar11];
            }
            else {
              uVar15 = uVar14 | puVar4[uVar11];
            }
            puVar4[uVar11] = uVar15;
            iVar13 = (int)uVar12;
            lVar16 = pGVar2->n_vertices;
          } while (((long)uVar12 < lVar16) && (uVar11 = uVar12, uVar8 == (uint)piVar3[uVar12]));
        }
        iVar10 = iVar13 - iVar9;
        iVar9 = iVar13;
      }
      else {
        iVar10 = 0;
        *(undefined4 *)((long)pvVar6 + uVar8 * 4) = 0xffffffff;
      }
      *(int *)((long)pvVar7 + uVar8 * 4) = iVar10;
      uVar8 = uVar8 + 1;
    } while (uVar8 != iVar1 + 1U);
    this->iterations = 1;
    if (-1 < iVar1) {
      iVar9 = 0;
      do {
        iVar10 = *(int *)((long)pvVar7 + (long)iVar9 * 4);
        if (iVar10 == 0) {
LAB_00159983:
          iVar9 = iVar9 + 1;
        }
        else {
          iVar13 = *(int *)((long)pvVar6 + (long)iVar9 * 4);
          iVar10 = update_block_rec(this,__lace_worker,__lace_dq_head,iVar13,iVar10);
          if (iVar10 == 0) goto LAB_00159983;
          if (iVar9 != 0) {
            freeze_thaw_reset_rec_CALL(__lace_worker,__lace_dq_head,this,0,iVar13,iVar9);
          }
          this->iterations = this->iterations + 1;
          iVar9 = 0;
          if (1 < (this->super_Solver).trace) {
            poVar5 = (this->super_Solver).logger;
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5,"restarting after finding distractions",0x25);
            std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
            std::ostream::put((char)poVar5);
            std::ostream::flush();
          }
        }
      } while (iVar9 <= iVar1);
    }
  }
  operator_delete__(pvVar6);
  operator_delete__(pvVar7);
  return;
}

Assistant:

void
FPISolver::run_par(WorkerP* __lace_worker, Task* __lace_dq_head)
{
    int d = this->priority(this->nodecount()-1);
    int *p_start = new int[d+1];
    int *p_len = new int[d+1];

    // initialize p_start, p_len, parity
    {
        int v=0;
        for (int p=0; p<=d; p++) {
            if (this->priority(v) == p) {
                p_start[p] = v;
                while (v < this->nodecount() and this->priority(v) == p) {
                    this->parity[v] = p&1;
                    v++;
                }
                p_len[p] = v - p_start[p];
            } else {
                p_start[p] = -1;
                p_len[p] = 0;
            }
        }
    }

    this->iterations = 1;
    int p = 0;
    while (p <= d) {
        if (p_len[p] == 0) {
            p++;
        } else if (CALL(update_block_rec, this, p_start[p], p_len[p])) {
            // something changed, freeze and reset
            if (p != 0) {
                CALL(freeze_thaw_reset_rec, this, 0, p_start[p], p);
                p = 0;
            }
            this->iterations++;
#ifndef NDEBUG
            if (this->trace >= 2) this->logger << "restarting after finding distractions" << std::endl;
#endif
        } else {
            // nothing changed
            p++;
        }
    }

    delete[] p_start;
    delete[] p_len;
}